

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMaj.c
# Opt level: O3

int Gem_Enumerate(int nVars,int fDump,int fVerbose)

{
  Vec_Mem_t *pVVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  Gem_Man_t *p;
  Gem_Obj_t *pGVar5;
  FILE *__stream;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  word *pwVar15;
  uint uVar16;
  timespec ts;
  long local_438;
  timespec local_418 [62];
  
  iVar4 = clock_gettime(3,local_418);
  if (iVar4 < 0) {
    local_438 = -1;
  }
  else {
    local_438 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
  }
  p = Gem_ManAlloc(nVars,fVerbose);
  if (nVars < 3) {
    uVar6 = p->nObjs;
  }
  else {
    uVar6 = p->nObjs;
    uVar14 = 1;
    uVar12 = uVar6;
    uVar10 = 1;
    do {
      uVar7 = uVar12;
      uVar13 = (uint)uVar14;
      printf("Expanding  var %2d (functions = %10d)  ",uVar14,(ulong)uVar7);
      iVar11 = 3;
      iVar4 = clock_gettime(3,local_418);
      if (iVar4 < 0) {
        lVar9 = -1;
      }
      else {
        lVar9 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
      }
      Abc_Print(iVar11,"%s =","Time");
      Abc_Print(iVar11,"%9.2f sec\n",(double)(lVar9 - local_438) / 1000000.0);
      uVar12 = uVar7;
      if (0 < (int)uVar7) {
        uVar8 = 0;
        do {
          uVar6 = *(uint *)(p->pObjs + uVar8) & 0xf;
          if ((uVar13 == uVar6) || (((long)(int)uVar10 <= (long)uVar8 && (uVar6 < uVar13)))) {
            uVar6 = 0;
            do {
              if ((*(ushort *)&p->pObjs[uVar8].field_0x2 >> (uVar6 & 0x1f) & 1) != 0) {
                Gem_FuncExpand(p,(int)uVar8,uVar6);
              }
              uVar6 = uVar6 + 1;
            } while (uVar13 != uVar6);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar7);
        uVar6 = p->nObjs;
        uVar12 = uVar6;
      }
      printf("Connecting var %2d (functions = %10d)  ",uVar14,(ulong)uVar12);
      iVar11 = 3;
      iVar4 = clock_gettime(3,local_418);
      if (iVar4 < 0) {
        lVar9 = -1;
      }
      else {
        lVar9 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
      }
      Abc_Print(iVar11,"%s =","Time");
      Abc_Print(iVar11,"%9.2f sec\n",(double)(lVar9 - local_438) / 1000000.0);
      if ((int)uVar7 < (int)uVar12) {
        lVar9 = (long)(int)uVar7;
        pGVar5 = p->pObjs;
        do {
          uVar12 = *(uint *)(pGVar5 + lVar9);
          if ((uVar12 & 0xf) != 0) {
            uVar6 = 0;
            do {
              uVar10 = uVar6 + 1;
              uVar3 = uVar6;
              if (uVar10 < (uVar12 & 0xf) && ((uVar12 >> 0x10) >> (uVar6 & 0x1f) & 1) != 0) {
                do {
                  if (((uVar12 >> 0x10) >> ((byte)uVar3 & 0x1f) & 2) != 0) {
                    Gem_FuncReduce(p,(int)lVar9,uVar6,uVar3 + 1);
                    pGVar5 = p->pObjs;
                  }
                  uVar12 = *(uint *)(pGVar5 + lVar9);
                  uVar16 = uVar3 + 2;
                  uVar3 = uVar3 + 1;
                } while (uVar16 < (uVar12 & 0xf));
              }
              uVar12 = *(uint *)(pGVar5 + lVar9);
              uVar6 = uVar10;
            } while (uVar10 < (uVar12 & 0xf));
            uVar6 = p->nObjs;
          }
          lVar9 = lVar9 + 1;
          uVar12 = uVar6;
        } while (lVar9 < (int)uVar6);
      }
      uVar14 = (ulong)(uVar13 + 1);
      uVar10 = uVar7;
    } while (uVar13 != nVars - 2U);
  }
  printf("Finished          (functions = %10d)  ",(ulong)uVar6);
  iVar11 = 3;
  iVar4 = clock_gettime(3,local_418);
  if (iVar4 < 0) {
    lVar9 = -1;
  }
  else {
    lVar9 = local_418[0].tv_nsec / 1000 + local_418[0].tv_sec * 1000000;
  }
  Abc_Print(iVar11,"%s =","Time");
  Abc_Print(iVar11,"%9.2f sec\n",(double)(lVar9 - local_438) / 1000000.0);
  if (fDump != 0) {
    pVVar1 = p->vTtMem;
    sprintf((char *)local_418,"tt_%s_%02d.txt","enum",(ulong)(uint)nVars);
    __stream = fopen((char *)local_418,"wb");
    if (_stdout == __stream) {
      printf("Memory vector has %d entries: \n",(ulong)(uint)pVVar1->nEntries);
    }
    uVar14 = (ulong)(uint)pVVar1->nEntries;
    if ((0 < pVVar1->nEntries) && (pwVar15 = *pVVar1->ppPages, pwVar15 != (word *)0x0)) {
      uVar6 = pVVar1->nEntrySize;
      uVar12 = 0;
      do {
        if (0 < (int)uVar6) {
          uVar14 = (ulong)uVar6;
          do {
            lVar9 = 0x3c;
            do {
              uVar6 = (uint)(pwVar15[uVar14 - 1] >> ((byte)lVar9 & 0x3f)) & 0xf;
              if (uVar6 < 10) {
                fprintf(__stream,"%d");
              }
              else {
                fputc(uVar6 + 0x37,__stream);
              }
              lVar9 = lVar9 + -4;
            } while (lVar9 != -4);
            bVar2 = 1 < (long)uVar14;
            uVar14 = uVar14 - 1;
          } while (bVar2);
        }
        fputc(10,__stream);
        uVar12 = uVar12 + 1;
        uVar14 = (ulong)(uint)pVVar1->nEntries;
        if (pVVar1->nEntries <= (int)uVar12) break;
        uVar6 = pVVar1->nEntrySize;
        pwVar15 = pVVar1->ppPages[uVar12 >> ((byte)pVVar1->LogPageSze & 0x1f)] +
                  (int)((pVVar1->PageMask & uVar12) * uVar6);
      } while (pVVar1->ppPages[uVar12 >> ((byte)pVVar1->LogPageSze & 0x1f)] != (word *)0x0);
    }
    if (__stream != _stdout) {
      fclose(__stream);
      uVar14 = (ulong)(uint)pVVar1->nEntries;
    }
    printf("Dumped %d %d-var truth tables into file \"%s\" (%.2f MB).\n",
           (double)pVVar1->nEntrySize * (double)(int)uVar14 * 8.0 * 9.5367431640625e-07,uVar14,
           (ulong)(uint)nVars,local_418);
  }
  Gem_ManFree(p);
  return 0;
}

Assistant:

int Gem_Enumerate( int nVars, int fDump, int fVerbose )
{
    abctime clk = Abc_Clock();
    Gem_Man_t * p = Gem_ManAlloc( nVars, fVerbose );
    int v, f, i, j, nObjsStop = 1;
    for ( v = 1; v <= nVars-2; v++ )
    {
        // expand functions by adding a gate
        int nObjsStopPrev = nObjsStop;
        nObjsStop = p->nObjs;
        printf( "Expanding  var %2d (functions = %10d)  ", v, p->nObjs );
        Abc_PrintTime( 0, "Time", Abc_Clock() - clk );
        for ( f = 0; f < nObjsStop; f++ )
            if ( v == (int)p->pObjs[f].nVars || (v > (int)p->pObjs[f].nVars && f >= nObjsStopPrev) )
                for ( i = 0; i < v; i++ )
                    if ( (int)p->pObjs[f].Groups & (1 << i) )
                        Gem_FuncExpand( p, f, i );
        // reduce functions by adding a crossbar
        printf( "Connecting var %2d (functions = %10d)  ", v, p->nObjs );
        Abc_PrintTime( 0, "Time", Abc_Clock() - clk );
        for ( f = nObjsStop; f < p->nObjs; f++ )
            for ( i = 0; i < (int)p->pObjs[f].nVars; i++ )
                if ( (int)p->pObjs[f].Groups & (1 << i) )
                    for ( j = i+1; j < (int)p->pObjs[f].nVars; j++ )
                        if ( (int)p->pObjs[f].Groups & (1 << j) )
                            if ( Gem_FuncReduce( p, f, i, j ) )
                                return Gem_ManFree( p );
    }
    printf( "Finished          (functions = %10d)  ", p->nObjs );
    Abc_PrintTime( 0, "Time", Abc_Clock() - clk );
    if ( fDump ) Vec_MemDumpTruthTables( p->vTtMem, "enum", nVars );
    Gem_ManFree( p );
    return 0;
}